

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall cursespp::Window::CheckForBoundsError(Window *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (((Window *)this->parent != (Window *)0x0) &&
     (bVar1 = CheckForBoundsError((Window *)this->parent), bVar1)) {
    return true;
  }
  iVar2 = Screen::GetHeight();
  iVar3 = Screen::GetWidth();
  uVar4 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x16])(this);
  uVar5 = (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x17])(this);
  bVar1 = true;
  if (((0 < (int)uVar5 && 0 < (int)uVar4) && ((int)uVar5 <= iVar2 && (int)uVar4 <= iVar3)) &&
     ((this->drawFrame != true || (2 < uVar5 && 2 < uVar4)))) {
    if (this->parent == (IWindow *)0x0) {
      bVar1 = false;
    }
    else {
      iVar2 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x19])();
      iVar3 = (*(this->parent->super_IOrderable)._vptr_IOrderable[0x18])();
      if (((this->width <= iVar2) && (this->height <= iVar3)) && ((int)(uVar4 + this->x) <= iVar2))
      {
        bVar1 = iVar3 < (int)(uVar5 + this->y);
      }
    }
  }
  return bVar1;
}

Assistant:

bool Window::CheckForBoundsError() {
    if (this->parent && ((Window *) this->parent)->CheckForBoundsError()) {
        return true;
    }

    int const screenCy = Screen::GetHeight();
    int const screenCx = Screen::GetWidth();

    int const cx = this->GetWidth();
    int const cy = this->GetHeight();

    if (cx <= 0 || cy <= 0) {
        return true;
    }

    if (cx > screenCx || cy > screenCy) {
        return true;
    }

    if (this->drawFrame && (cx < 3 || cy < 3)) {
        /* if a frame is visible, the minimum x and y dimensions are
        2 cells -- the left+right (and top+bottom) border, plus the
        content area (at least 1 cell) */
        return true;
    }

    if (!this->parent) {
        return false;
    }

    const int parentWidth = this->parent->GetContentWidth();
    const int parentHeight = this->parent->GetContentHeight();

    if (this->width > parentWidth || this->height > parentHeight) {
        return true;
    }

    const int right = this->x + cx;
    const int bottom = this->y + cy;

    if (right > parentWidth || bottom > parentHeight) {
        return true;
    }

    return false;
}